

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPToClause::generateDOT
          (OpenMPToClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  bool bVar1;
  pointer ppcVar2;
  allocator<char> local_1fd;
  int local_1fc;
  string mapper_identifier_name;
  string node_id_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string mapper_identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string parameter_string;
  string indent;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string clause_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  std::__cxx11::to_string(&node_id_1,depth);
  std::operator+(&mapper_identifier,"to_",&node_id_1);
  std::operator+(&parameter_string,&mapper_identifier,"_");
  std::__cxx11::to_string(&mapper_identifier_name,index);
  std::operator+(&clause_kind,&parameter_string,&mapper_identifier_name);
  std::__cxx11::string::~string((string *)&mapper_identifier_name);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&mapper_identifier);
  std::__cxx11::string::~string((string *)&node_id_1);
  std::operator+(&mapper_identifier_name,&indent,parent_node);
  std::operator+(&node_id_1,&mapper_identifier_name,"-- ");
  std::operator+(&mapper_identifier,&node_id_1,&clause_kind);
  std::operator+(&parameter_string,&mapper_identifier,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&parameter_string);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&mapper_identifier);
  std::__cxx11::string::~string((string *)&node_id_1);
  std::__cxx11::string::~string((string *)&mapper_identifier_name);
  std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  parameter_string._M_dataplus._M_p = (pointer)&parameter_string.field_2;
  parameter_string._M_string_length = 0;
  parameter_string.field_2._M_local_buf[0] = '\0';
  if (this->to_kind == OMPC_TO_mapper) {
    std::__cxx11::string::assign((char *)&parameter_string);
    if (parameter_string._M_string_length != 0) {
      std::operator+(&mapper_identifier,&clause_kind,"_kind");
      std::operator+(&local_1b0,&indent,&clause_kind);
      std::operator+(&local_150,&local_1b0," -- ");
      std::operator+(&mapper_identifier_name,&local_150,&mapper_identifier);
      std::operator+(&node_id_1,&mapper_identifier_name,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&node_id_1);
      std::__cxx11::string::~string((string *)&node_id_1);
      std::__cxx11::string::~string((string *)&mapper_identifier_name);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_b0,&indent,"\t");
      std::operator+(&local_130,&local_b0,&mapper_identifier);
      std::operator+(&local_170,&local_130," [label = \"");
      std::operator+(&local_1b0,&local_170,&mapper_identifier);
      std::operator+(&local_150,&local_1b0,"\\n ");
      std::operator+(&mapper_identifier_name,&local_150,&parameter_string);
      std::operator+(&node_id_1,&mapper_identifier_name,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&node_id_1);
      std::__cxx11::string::~string((string *)&node_id_1);
      std::__cxx11::string::~string((string *)&mapper_identifier_name);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&mapper_identifier);
    }
  }
  std::__cxx11::string::string((string *)&mapper_identifier,(string *)&this->mapper_identifier);
  bVar1 = std::operator!=(&mapper_identifier,"");
  if (bVar1) {
    std::operator+(&node_id_1,&clause_kind,"_kind");
    std::__cxx11::string::_M_assign((string *)&parameter_string);
    std::operator+(&mapper_identifier_name,&clause_kind,"_mapper_identifier");
    std::operator+(&local_130,&indent,&node_id_1);
    std::operator+(&local_170,&local_130," -- ");
    std::operator+(&local_1b0,&local_170,&mapper_identifier_name);
    std::operator+(&local_150,&local_1b0,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_70,&indent,"\t");
    std::operator+(&local_50,&local_70,&mapper_identifier_name);
    std::operator+(&local_b0,&local_50," [label = \"");
    std::operator+(&local_130,&local_b0,&mapper_identifier_name);
    std::operator+(&local_170,&local_130,"\\n ");
    std::operator+(&local_1b0,&local_170,&parameter_string);
    std::operator+(&local_150,&local_1b0,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&mapper_identifier_name);
    std::__cxx11::string::~string((string *)&node_id_1);
  }
  node_id_1._M_dataplus._M_p = (pointer)&node_id_1.field_2;
  node_id_1._M_string_length = 0;
  node_id_1.field_2._M_local_buf[0] = '\0';
  ppcVar2 = (this->super_OpenMPClause).expressions.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1fc = 0;
  for (; ppcVar2 !=
         (this->super_OpenMPClause).expressions.
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
    std::operator+(&local_150,&clause_kind,"_expr");
    std::__cxx11::to_string(&local_1b0,local_1fc);
    std::operator+(&mapper_identifier_name,&local_150,&local_1b0);
    std::__cxx11::string::operator=((string *)&node_id_1,(string *)&mapper_identifier_name);
    std::__cxx11::string::~string((string *)&mapper_identifier_name);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_150);
    std::operator+(&local_170,&indent,&clause_kind);
    std::operator+(&local_1b0,&local_170," -- ");
    std::operator+(&local_150,&local_1b0,&node_id_1);
    std::operator+(&mapper_identifier_name,&local_150,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&mapper_identifier_name);
    std::__cxx11::string::~string((string *)&mapper_identifier_name);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_170);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_50,&indent,"\t");
    std::operator+(&local_b0,&local_50,&node_id_1);
    std::operator+(&local_130,&local_b0," [label = \"");
    std::operator+(&local_170,&local_130,&node_id_1);
    std::operator+(&local_1b0,&local_170,"\\n ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,*ppcVar2,&local_1fd);
    std::operator+(&local_150,&local_1b0,&local_70);
    std::operator+(&mapper_identifier_name,&local_150,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&mapper_identifier_name);
    std::__cxx11::string::~string((string *)&mapper_identifier_name);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    local_1fc = local_1fc + 1;
  }
  std::__cxx11::string::~string((string *)&node_id_1);
  std::__cxx11::string::~string((string *)&mapper_identifier);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&clause_kind);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  return;
}

Assistant:

void OpenMPToClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "to_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPToClauseKind kind = this->getKind();
    std::string parameter_string;
    switch (kind) {
        case OMPC_TO_mapper:
            parameter_string = "mapper";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
    std::string mapper_identifier = this->getMapperIdentifier();
    if (mapper_identifier != "") {
    std::string node_id =  clause_kind+ "_kind";
        parameter_string = mapper_identifier;
        std::string mapper_identifier_name = clause_kind + "_mapper_identifier";
        current_line = indent + node_id + " -- " + mapper_identifier_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + mapper_identifier_name + " [label = \"" + mapper_identifier_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };    


 std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}